

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

void qpdf_set_r2_encryption_parameters_insecure
               (qpdf_data qpdf,char *user_password,char *owner_password,QPDF_BOOL allow_print,
               QPDF_BOOL allow_modify,QPDF_BOOL allow_extract,QPDF_BOOL allow_annotate)

{
  element_type *this;
  QPDF_BOOL allow_extract_local;
  QPDF_BOOL allow_modify_local;
  QPDF_BOOL allow_print_local;
  char *owner_password_local;
  char *user_password_local;
  qpdf_data qpdf_local;
  
  QTC::TC("qpdf","qpdf-c called qpdf_set_r2_encryption_parameters_insecure",0);
  this = std::__shared_ptr_access<QPDFWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                   ((__shared_ptr_access<QPDFWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    &qpdf->qpdf_writer);
  QPDFWriter::setR2EncryptionParametersInsecure
            (this,user_password,owner_password,allow_print != 0,allow_modify != 0,allow_extract != 0
             ,allow_annotate != 0);
  return;
}

Assistant:

void
qpdf_set_r2_encryption_parameters_insecure(
    qpdf_data qpdf,
    char const* user_password,
    char const* owner_password,
    QPDF_BOOL allow_print,
    QPDF_BOOL allow_modify,
    QPDF_BOOL allow_extract,
    QPDF_BOOL allow_annotate)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_set_r2_encryption_parameters_insecure");
    qpdf->qpdf_writer->setR2EncryptionParametersInsecure(
        user_password,
        owner_password,
        allow_print != QPDF_FALSE,
        allow_modify != QPDF_FALSE,
        allow_extract != QPDF_FALSE,
        allow_annotate != QPDF_FALSE);
}